

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

void LowererMD::Legalize<false>(Instr *instr,bool fPostRegAlloc)

{
  OpCode o1;
  code *pcVar1;
  bool bVar2;
  LegalForms LVar3;
  OpndKind OVar4;
  RegNum RVar5;
  LegalForms LVar6;
  IRType IVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  BOOL BVar12;
  undefined4 *puVar13;
  Opnd *pOVar14;
  ulong uVar15;
  IntConstOpnd *pIVar16;
  long lVar17;
  Instr *pIVar18;
  RegOpnd *pRVar19;
  Opnd *opnd;
  MemRefOpnd *pMVar20;
  size_t sVar21;
  int64 value;
  IRType local_f1;
  IRType local_e9;
  IntConstOpnd *local_a0;
  LegalInstrForms *local_80;
  Instr *newInstr;
  uint32 srcMask;
  uint32 dstMask;
  anon_class_1_0_00000001 getRegMask;
  RegNum edx;
  anon_class_24_3_e5e18913 UpdateIntConstantSrc;
  IntConstOpnd *intConstantSrc;
  IRType srcType;
  Opnd *src;
  Opnd *pOStack_28;
  IRType dstType;
  Opnd *dst;
  LegalForms local_18;
  LegalForms local_17;
  undefined2 local_16;
  LegalForms local_14;
  bool isCustomForm;
  bool hasSwitchCase;
  LegalForms src2Forms;
  LegalForms src1Forms;
  LegalForms dstForms;
  LegalInstrForms legalInstrForms;
  bool isMDOpCode;
  bool fPostRegAlloc_local;
  Instr *instr_local;
  
  src2Forms = fPostRegAlloc;
  _src1Forms = instr;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x5c6,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  if ((*(ushort *)&_src1Forms->field_0x36 >> 5 & 1) != 0) {
    if (_src1Forms->m_opcode == MOV) {
      pOVar14 = IR::Instr::GetSrc1(_src1Forms);
      bVar2 = IR::Opnd::IsIntConstOpnd(pOVar14);
      if (bVar2) goto LAB_00896e33;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x5c8,
                       "(!instr->isInlineeEntryInstr || (instr->m_opcode == Js::OpCode::MOV && instr->GetSrc1()->IsIntConstOpnd()))"
                       ,
                       "!instr->isInlineeEntryInstr || (instr->m_opcode == Js::OpCode::MOV && instr->GetSrc1()->IsIntConstOpnd())"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
LAB_00896e33:
  hasSwitchCase = MDStart < _src1Forms->m_opcode;
  if ((!hasSwitchCase) &&
     (bVar2 = Lowerer::ValidOpcodeAfterLower(_src1Forms,_src1Forms->m_func), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x5cb,"(isMDOpCode || Lowerer::ValidOpcodeAfterLower(instr, instr->m_func))"
                       ,"isMDOpCode || Lowerer::ValidOpcodeAfterLower(instr, instr->m_func)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  if ((hasSwitchCase & 1U) == 0) {
    local_80 = (LegalInstrForms *)&LegalInstrFormsImpl::LEGAL_NONE;
  }
  else {
    o1 = _src1Forms->m_opcode;
    uVar8 = Js::operator+(MDStart,1);
    uVar8 = Js::operator-(o1,uVar8);
    local_80 = AllLegalInstrForms + uVar8;
  }
  dst._7_1_ = local_80->src[1];
  local_16._0_1_ = local_80->dst;
  local_16._1_1_ = local_80->src[0];
  local_17 = (undefined1)local_16;
  local_18 = local_16._1_1_;
  dst._6_1_ = 1;
  local_14 = dst._7_1_;
  LVar3 = ::operator&((undefined1)local_16,LF_Custom);
  dst._5_1_ = LVar3 != L_None;
  switch(*(int *)&_src1Forms->m_opcode - 0x3e6U & 0xffff) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    pOVar14 = IR::Instr::GetSrc2(_src1Forms);
    if (pOVar14 == (Opnd *)0x0) {
      pOVar14 = IR::Instr::GetDst(_src1Forms);
      iVar11 = IR::Opnd::GetSize(pOVar14);
      pOVar14 = IR::Instr::GetSrc1(_src1Forms);
      iVar10 = IR::Opnd::GetSize(pOVar14);
      if (iVar11 != iVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x6b8,"(instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize())",
                           "instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      pIVar18 = _src1Forms;
      LVar3 = operator|(L_Reg,L_Mem);
      LegalizeOpnds<false>(pIVar18,L_Reg,LVar3,L_None);
    }
    else {
      pOVar14 = IR::Instr::GetDst(_src1Forms);
      iVar11 = IR::Opnd::GetSize(pOVar14);
      pOVar14 = IR::Instr::GetSrc2(_src1Forms);
      iVar10 = IR::Opnd::GetSize(pOVar14);
      if (iVar11 != iVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x6a6,"(instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize())",
                           "instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      pOVar14 = IR::Instr::GetDst(_src1Forms);
      iVar11 = IR::Opnd::GetSize(pOVar14);
      pOVar14 = IR::Instr::GetSrc1(_src1Forms);
      iVar10 = IR::Opnd::GetSize(pOVar14);
      if (iVar11 != iVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x6a7,"(instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize())",
                           "instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      pOVar14 = IR::Instr::GetSrc2(_src1Forms);
      bVar2 = IR::Opnd::IsIntConstOpnd(pOVar14);
      if (bVar2) {
        pOVar14 = IR::Instr::GetSrc2(_src1Forms);
        pIVar16 = IR::Opnd::AsIntConstOpnd(pOVar14);
        lVar17 = IR::EncodableOpnd<long>::GetValue(&pIVar16->super_EncodableOpnd<long>);
        if (lVar17 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                             ,0x6ae,
                             "(!instr->GetSrc2()->IsIntConstOpnd() || instr->GetSrc2()->AsIntConstOpnd()->GetValue() != 0)"
                             ,
                             "!instr->GetSrc2()->IsIntConstOpnd() || instr->GetSrc2()->AsIntConstOpnd()->GetValue() != 0"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
      }
      pIVar18 = _src1Forms;
      LVar3 = operator|(L_Reg,L_Mem);
      LegalizeOpnds<false>(pIVar18,L_Reg,L_Reg,LVar3);
    }
    goto LAB_00898433;
  default:
    break;
  case 0x1a:
  case 0x49:
    if (((*(uint *)&_src1Forms->m_func->field_0x240 >> 0x19 & 1) != 0) &&
       (pOVar14 = IR::Instr::GetDst(_src1Forms), pOVar14 != (Opnd *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x6f3,"(!instr->m_func->isPostFinalLower || !instr->GetDst())",
                         "After FinalLower, there should not be a dst");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    if ((*(uint *)&_src1Forms->m_func->field_0x240 >> 0x19 & 1) == 0) {
      pOVar14 = IR::Instr::GetDst(_src1Forms);
      iVar11 = Legalize<false>::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)((long)&srcMask + 2),pOVar14);
      if (iVar11 != 10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x6f5,
                           "(instr->m_func->isPostFinalLower || getRegMask(instr->GetDst()) == dstMask)"
                           ,"Before FinalLower, instr should have eax,edx as dst");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
    }
    if (((*(uint *)&_src1Forms->m_func->field_0x240 >> 0x19 & 1) != 0) &&
       (pOVar14 = IR::Instr::GetSrc2(_src1Forms), pOVar14 != (Opnd *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x6f6,"(!instr->m_func->isPostFinalLower || !instr->GetSrc2())",
                         "After FinalLower, there should not be a src2");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    if ((*(uint *)&_src1Forms->m_func->field_0x240 >> 0x19 & 1) == 0) {
      pOVar14 = IR::Instr::GetSrc2(_src1Forms);
      iVar11 = Legalize<false>::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)((long)&srcMask + 2),pOVar14);
      if (iVar11 != 0x1e) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x6f8,
                           "(instr->m_func->isPostFinalLower || getRegMask(instr->GetSrc2()) == srcMask)"
                           ,"Before FinalLower, instr should have eax,edx,ecx,ebx as src2");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
    }
    pIVar18 = _src1Forms;
    pOVar14 = IR::Instr::GetSrc1(_src1Forms);
    LegalizeSrc<false>(pIVar18,pOVar14,L_Mem);
    goto LAB_00898433;
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
    bVar2 = IR::Instr::IsBranchInstr(_src1Forms);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x5e7,"(instr->IsBranchInstr())","instr->IsBranchInstr()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    goto LAB_00898433;
  case 0x4b:
    BVar12 = AutoSystemInfo::LZCntAvailable(&AutoSystemInfo::Data);
    if (BVar12 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x726,"(AutoSystemInfo::Data.LZCntAvailable())",
                         "AutoSystemInfo::Data.LZCntAvailable()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    break;
  case 0x51:
    pOVar14 = IR::Instr::GetSrc2(_src1Forms);
    if (pOVar14 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x5ec,"(instr->GetSrc2() == nullptr)","instr->GetSrc2() == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    pOStack_28 = IR::Instr::GetDst(_src1Forms);
    src._7_1_ = IR::Opnd::GetType(pOStack_28);
    pOVar14 = IR::Instr::GetSrc1(_src1Forms);
    IVar7 = IR::Opnd::GetType(pOVar14);
    if (TySize[IVar7] < TySize[src._7_1_]) {
      uVar9 = (uint)src._7_1_;
      if (((1 < uVar9 - 3) && (1 < uVar9 - 7)) && (uVar9 != 0x17)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x605,"(false)","false");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      bVar2 = IR::Opnd::IsIntConstOpnd(pOVar14);
      if (bVar2) {
        local_a0 = IR::Opnd::AsIntConstOpnd(pOVar14);
      }
      else {
        local_a0 = (IntConstOpnd *)0x0;
      }
      UpdateIntConstantSrc.instr = (Instr **)local_a0;
      _dstMask = &UpdateIntConstantSrc.instr;
      UpdateIntConstantSrc.intConstantSrc = (IntConstOpnd **)((long)&src + 7);
      UpdateIntConstantSrc.dstType = &src1Forms;
      switch(IVar7) {
      case TyInt8:
        if (local_a0 == (IntConstOpnd *)0x0) {
          _src1Forms->m_opcode = MOVSX;
        }
        else {
          lVar17 = IR::EncodableOpnd<long>::GetValue(&local_a0->super_EncodableOpnd<long>);
          Legalize<false>::anon_class_24_3_e5e18913::operator()
                    ((anon_class_24_3_e5e18913 *)&dstMask,(long)(char)lVar17);
        }
        break;
      case TyInt16:
        if (local_a0 == (IntConstOpnd *)0x0) {
          _src1Forms->m_opcode = MOVSXW;
        }
        else {
          lVar17 = IR::EncodableOpnd<long>::GetValue(&local_a0->super_EncodableOpnd<long>);
          Legalize<false>::anon_class_24_3_e5e18913::operator()
                    ((anon_class_24_3_e5e18913 *)&dstMask,(long)(short)lVar17);
        }
        break;
      case TyInt32:
        if (local_a0 == (IntConstOpnd *)0x0) {
          _src1Forms->m_opcode = MOVSXD;
        }
        else {
          lVar17 = IR::EncodableOpnd<long>::GetValue(&local_a0->super_EncodableOpnd<long>);
          Legalize<false>::anon_class_24_3_e5e18913::operator()
                    ((anon_class_24_3_e5e18913 *)&dstMask,(long)(int)lVar17);
        }
        break;
      default:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x66f,"(false)","false");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
        break;
      case TyUint8:
        if (local_a0 == (IntConstOpnd *)0x0) {
          _src1Forms->m_opcode = MOVZX;
        }
        else {
          uVar15 = IR::EncodableOpnd<long>::GetValue(&local_a0->super_EncodableOpnd<long>);
          Legalize<false>::anon_class_24_3_e5e18913::operator()
                    ((anon_class_24_3_e5e18913 *)&dstMask,uVar15 & 0xff);
        }
        break;
      case TyUint16:
        if (local_a0 == (IntConstOpnd *)0x0) {
          _src1Forms->m_opcode = MOVZXW;
        }
        else {
          uVar15 = IR::EncodableOpnd<long>::GetValue(&local_a0->super_EncodableOpnd<long>);
          Legalize<false>::anon_class_24_3_e5e18913::operator()
                    ((anon_class_24_3_e5e18913 *)&dstMask,uVar15 & 0xffff);
        }
        break;
      case TyUint32:
        if (local_a0 == (IntConstOpnd *)0x0) {
          OVar4 = IR::Opnd::GetKind(pOStack_28);
          switch(OVar4) {
          case OpndKindSym:
          case OpndKindIndir:
          case OpndKindMemRef:
            IR::Instr::HoistSrc1(_src1Forms,MOV_TRUNC,RegNOREG,(StackSym *)0x0);
            pOVar14 = IR::Instr::GetSrc1(_src1Forms);
            IR::Opnd::SetType(pOVar14,src._7_1_);
            break;
          case OpndKindReg:
            IR::Opnd::SetType(pOStack_28,TyUint32);
            _src1Forms->m_opcode = MOV_TRUNC;
            break;
          default:
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                               ,0x668,"(false)","false");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 0;
          }
        }
        else {
          uVar15 = IR::EncodableOpnd<long>::GetValue(&local_a0->super_EncodableOpnd<long>);
          Legalize<false>::anon_class_24_3_e5e18913::operator()
                    ((anon_class_24_3_e5e18913 *)&dstMask,uVar15 & 0xffffffff);
        }
      }
    }
    else if (TySize[src._7_1_] < TySize[IVar7]) {
      pOVar14 = IR::Instr::GetSrc1(_src1Forms);
      IVar7 = IR::Opnd::GetType(pOStack_28);
      IR::Opnd::SetType(pOVar14,IVar7);
    }
    pIVar18 = _src1Forms;
    if (_src1Forms->m_opcode == MOV) {
      LVar3 = operator|(L_Reg,L_Mem);
      local_18 = operator|(LVar3,L_Ptr);
      bVar2 = IR::Opnd::IsMemoryOpnd(pOStack_28);
      if (bVar2) {
        local_18 = operator|(L_Reg,L_Imm32);
      }
      pIVar18 = _src1Forms;
      LVar3 = operator|(L_Reg,L_Mem);
      LegalizeOpnds<false>(pIVar18,LVar3,local_18,L_None);
    }
    else {
      LVar3 = operator|(L_Reg,L_Mem);
      LegalizeOpnds<false>(pIVar18,L_Reg,LVar3,L_None);
    }
    goto LAB_00898433;
  case 0x5d:
  case 0x5e:
    pOVar14 = IR::Instr::GetDst(_src1Forms);
    IVar7 = IR::Opnd::GetType(pOVar14);
    local_e9 = TyFloat64;
    if (_src1Forms->m_opcode != MOVSD) {
      local_e9 = TyFloat32;
    }
    if (IVar7 != local_e9) {
      pOVar14 = IR::Instr::GetDst(_src1Forms);
      bVar2 = IR::Opnd::IsSimd128(pOVar14);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x6c3,
                           "(instr->GetDst()->GetType() == (instr->m_opcode == Js::OpCode::MOVSD? TyFloat64 : TyFloat32) || instr->GetDst()->IsSimd128())"
                           ,
                           "instr->GetDst()->GetType() == (instr->m_opcode == Js::OpCode::MOVSD? TyFloat64 : TyFloat32) || instr->GetDst()->IsSimd128()"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
    }
    pOVar14 = IR::Instr::GetSrc1(_src1Forms);
    IVar7 = IR::Opnd::GetType(pOVar14);
    local_f1 = TyFloat64;
    if (_src1Forms->m_opcode != MOVSD) {
      local_f1 = TyFloat32;
    }
    if (IVar7 != local_f1) {
      pOVar14 = IR::Instr::GetSrc1(_src1Forms);
      bVar2 = IR::Opnd::IsSimd128(pOVar14);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x6c4,
                           "(instr->GetSrc1()->GetType() == (instr->m_opcode == Js::OpCode::MOVSD ? TyFloat64 : TyFloat32) || instr->GetSrc1()->IsSimd128())"
                           ,
                           "instr->GetSrc1()->GetType() == (instr->m_opcode == Js::OpCode::MOVSD ? TyFloat64 : TyFloat32) || instr->GetSrc1()->IsSimd128()"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
    }
    break;
  case 0x5f:
  case 0x61:
    pOVar14 = IR::Instr::GetDst(_src1Forms);
    iVar11 = IR::Opnd::GetSize(pOVar14);
    if (iVar11 != 4) {
      pOVar14 = IR::Instr::GetDst(_src1Forms);
      iVar11 = IR::Opnd::GetSize(pOVar14);
      if (iVar11 != 8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x6d5,
                           "(instr->GetDst()->GetSize() == 4 || instr->GetDst()->GetSize() == 8)",
                           "instr->GetDst()->GetSize() == 4 || instr->GetDst()->GetSize() == 8");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
    }
    if (_src1Forms->m_opcode == MOVSX) {
      pOVar14 = IR::Instr::GetSrc1(_src1Forms);
      iVar11 = IR::Opnd::GetSize(pOVar14);
      if (iVar11 != 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x6d6,
                           "(instr->m_opcode != Js::OpCode::MOVSX || instr->GetSrc1()->GetSize() == 1)"
                           ,
                           "instr->m_opcode != Js::OpCode::MOVSX || instr->GetSrc1()->GetSize() == 1"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
    }
    if (_src1Forms->m_opcode == MOVSXW) {
      pOVar14 = IR::Instr::GetSrc1(_src1Forms);
      iVar11 = IR::Opnd::GetSize(pOVar14);
      if (iVar11 != 2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x6d7,
                           "(instr->m_opcode != Js::OpCode::MOVSXW || instr->GetSrc1()->GetSize() == 2)"
                           ,
                           "instr->m_opcode != Js::OpCode::MOVSXW || instr->GetSrc1()->GetSize() == 2"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
    }
    break;
  case 0x6a:
    pOVar14 = IR::Instr::GetSrc2(_src1Forms);
    if (pOVar14 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x6c9,"(!instr->GetSrc2())","!instr->GetSrc2()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    srcMask._3_1_ = RegArg2;
    pOVar14 = IR::Instr::GetDst(_src1Forms);
    if (pOVar14 != (Opnd *)0x0) {
      pOVar14 = IR::Instr::GetDst(_src1Forms);
      bVar2 = IR::Opnd::IsRegOpnd(pOVar14);
      if (bVar2) {
        pOVar14 = IR::Instr::GetDst(_src1Forms);
        pRVar19 = IR::Opnd::AsRegOpnd(pOVar14);
        RVar5 = IR::RegOpnd::GetReg(pRVar19);
        if (RVar5 == srcMask._3_1_) goto LAB_00898433;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x6d0,
                         "(!instr->GetDst() || (instr->GetDst()->IsRegOpnd() && instr->GetDst()->AsRegOpnd()->GetReg() == edx))"
                         ,
                         "!instr->GetDst() || (instr->GetDst()->IsRegOpnd() && instr->GetDst()->AsRegOpnd()->GetReg() == edx)"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    goto LAB_00898433;
  case 0xa7:
  case 0xa8:
  case 0xab:
  case 0xb8:
  case 0xba:
    pOVar14 = IR::Instr::GetSrc2(_src1Forms);
    bVar2 = IR::Opnd::IsIntConstOpnd(pOVar14);
    if (!bVar2) {
      pIVar18 = IR::Instr::HoistSrc2(_src1Forms,MOV,RegNOREG,(StackSym *)0x0);
      pOVar14 = IR::Instr::GetDst(pIVar18);
      pRVar19 = IR::Opnd::AsRegOpnd(pOVar14);
      RVar5 = LowererMDArch::GetRegShiftCount();
      IR::RegOpnd::SetReg(pRVar19,RVar5);
      pOVar14 = IR::Instr::GetSrc2(_src1Forms);
      pRVar19 = IR::Opnd::AsRegOpnd(pOVar14);
      RVar5 = LowererMDArch::GetRegShiftCount();
      IR::RegOpnd::SetReg(pRVar19,RVar5);
    }
    pOVar14 = IR::Instr::GetSrc2(_src1Forms);
    IR::Opnd::SetType(pOVar14,TyUint8);
    break;
  case 0xa9:
  case 0xaa:
    BVar12 = AutoSystemInfo::SSE4_1Available(&AutoSystemInfo::Data);
    if (BVar12 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x72b,"(AutoSystemInfo::Data.SSE4_1Available())",
                         "AutoSystemInfo::Data.SSE4_1Available()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    break;
  case 0xc6:
    pOVar14 = IR::Instr::GetSrc1(_src1Forms);
    bVar2 = IR::Opnd::IsImmediateOpnd(pOVar14);
    if (bVar2) {
      pOVar14 = IR::Instr::GetSrc2(_src1Forms);
      bVar2 = IR::Opnd::IsImmediateOpnd(pOVar14);
      if (bVar2) goto LAB_0089806f;
LAB_0089809b:
      IR::Instr::SwapOpnds(_src1Forms);
    }
    else {
LAB_0089806f:
      pOVar14 = IR::Instr::GetSrc2(_src1Forms);
      bVar2 = IR::Opnd::IsMemoryOpnd(pOVar14);
      if (bVar2) {
        pOVar14 = IR::Instr::GetSrc1(_src1Forms);
        bVar2 = IR::Opnd::IsMemoryOpnd(pOVar14);
        if (!bVar2) goto LAB_0089809b;
      }
    }
    break;
  case 199:
    BVar12 = AutoSystemInfo::TZCntAvailable(&AutoSystemInfo::Data);
    if (BVar12 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x723,"(AutoSystemInfo::Data.TZCntAvailable())",
                         "AutoSystemInfo::Data.TZCntAvailable()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
  }
  if ((hasSwitchCase & 1U) != 0) {
    if ((dst._5_1_ & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x732,"(!isCustomForm)",
                         "Custom legal forms should have a case in the switch statement");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    dst._6_1_ = 0;
    bVar2 = EncoderMD::IsOPEQ(_src1Forms);
    if (bVar2) {
      MakeDstEquSrc1<false>(_src1Forms);
      LVar3 = ::operator&(local_17,L_FormMask);
      LVar6 = ::operator&(local_18,L_FormMask);
      if (LVar3 != LVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x738,"((dstForms & L_FormMask) == (src1Forms & L_FormMask))",
                           "(dstForms & L_FormMask) == (src1Forms & L_FormMask)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
    }
    LegalizeOpnds<false>(_src1Forms,local_17,local_18,dst._7_1_);
  }
LAB_00898433:
  pOVar14 = IR::Instr::GetDst(_src1Forms);
  if (pOVar14 != (Opnd *)0x0) {
    pOVar14 = IR::Instr::GetDst(_src1Forms);
    bVar2 = IR::Opnd::IsMemoryOpnd(pOVar14);
    if (bVar2) {
      pOVar14 = IR::Instr::GetDst(_src1Forms);
      bVar2 = IR::Opnd::IsMemRefOpnd(pOVar14);
      if (bVar2) {
        pOVar14 = IR::Instr::GetDst(_src1Forms);
        pMVar20 = IR::Opnd::AsMemRefOpnd(pOVar14);
        sVar21 = IR::MemRefOpnd::GetMemLoc(pMVar20);
        bVar2 = Math::FitsInDWord(sVar21);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                             ,0x74a,
                             "(!instr->GetDst()->IsMemRefOpnd() || Math::FitsInDWord((size_t)instr->GetDst()->AsMemRefOpnd()->GetMemLoc()))"
                             ,
                             "!instr->GetDst()->IsMemRefOpnd() || Math::FitsInDWord((size_t)instr->GetDst()->AsMemRefOpnd()->GetMemLoc())"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
      }
      pOVar14 = IR::Instr::GetSrc1(_src1Forms);
      if (pOVar14 != (Opnd *)0x0) {
        pOVar14 = IR::Instr::GetSrc1(_src1Forms);
        opnd = IR::Instr::GetDst(_src1Forms);
        bVar2 = IR::Opnd::IsEqual(pOVar14,opnd);
        if (!bVar2) {
          pOVar14 = IR::Instr::GetSrc1(_src1Forms);
          bVar2 = IR::Opnd::IsMemoryOpnd(pOVar14);
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                               ,0x74d,
                               "(instr->GetSrc1()->IsEqual(instr->GetDst()) || !instr->GetSrc1()->IsMemoryOpnd())"
                               ,
                               "instr->GetSrc1()->IsEqual(instr->GetDst()) || !instr->GetSrc1()->IsMemoryOpnd()"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 0;
          }
        }
        pOVar14 = IR::Instr::GetSrc2(_src1Forms);
        if (pOVar14 != (Opnd *)0x0) {
          pOVar14 = IR::Instr::GetSrc2(_src1Forms);
          bVar2 = IR::Opnd::IsMemoryOpnd(pOVar14);
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                               ,0x750,"(!instr->GetSrc2()->IsMemoryOpnd())",
                               "!instr->GetSrc2()->IsMemoryOpnd()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 0;
          }
        }
      }
      goto LAB_008988b9;
    }
  }
  pOVar14 = IR::Instr::GetSrc1(_src1Forms);
  if (pOVar14 != (Opnd *)0x0) {
    pOVar14 = IR::Instr::GetSrc1(_src1Forms);
    bVar2 = IR::Opnd::IsMemoryOpnd(pOVar14);
    if (bVar2) {
      pOVar14 = IR::Instr::GetSrc1(_src1Forms);
      bVar2 = IR::Opnd::IsMemRefOpnd(pOVar14);
      if (bVar2) {
        pOVar14 = IR::Instr::GetSrc1(_src1Forms);
        pMVar20 = IR::Opnd::AsMemRefOpnd(pOVar14);
        sVar21 = IR::MemRefOpnd::GetMemLoc(pMVar20);
        bVar2 = Math::FitsInDWord(sVar21);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                             ,0x757,
                             "(!instr->GetSrc1()->IsMemRefOpnd() || Math::FitsInDWord((size_t)instr->GetSrc1()->AsMemRefOpnd()->GetMemLoc()))"
                             ,
                             "!instr->GetSrc1()->IsMemRefOpnd() || Math::FitsInDWord((size_t)instr->GetSrc1()->AsMemRefOpnd()->GetMemLoc())"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
      }
      pOVar14 = IR::Instr::GetSrc2(_src1Forms);
      if (pOVar14 != (Opnd *)0x0) {
        pOVar14 = IR::Instr::GetSrc2(_src1Forms);
        bVar2 = IR::Opnd::IsMemoryOpnd(pOVar14);
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                             ,0x758,"(!instr->GetSrc2() || !instr->GetSrc2()->IsMemoryOpnd())",
                             "!instr->GetSrc2() || !instr->GetSrc2()->IsMemoryOpnd()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
      }
      goto LAB_008988b9;
    }
  }
  pOVar14 = IR::Instr::GetSrc2(_src1Forms);
  if (pOVar14 != (Opnd *)0x0) {
    pOVar14 = IR::Instr::GetSrc2(_src1Forms);
    bVar2 = IR::Opnd::IsMemRefOpnd(pOVar14);
    if (bVar2) {
      pOVar14 = IR::Instr::GetSrc2(_src1Forms);
      pMVar20 = IR::Opnd::AsMemRefOpnd(pOVar14);
      sVar21 = IR::MemRefOpnd::GetMemLoc(pMVar20);
      bVar2 = Math::FitsInDWord(sVar21);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x75d,
                           "(Math::FitsInDWord((size_t)instr->GetSrc2()->AsMemRefOpnd()->GetMemLoc()))"
                           ,
                           "Math::FitsInDWord((size_t)instr->GetSrc2()->AsMemRefOpnd()->GetMemLoc())"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
    }
  }
LAB_008988b9:
  pOVar14 = IR::Instr::GetSrc2(_src1Forms);
  if (pOVar14 != (Opnd *)0x0) {
    pOVar14 = IR::Instr::GetSrc2(_src1Forms);
    bVar2 = IR::Opnd::IsImmediateOpnd(pOVar14);
    if (bVar2) {
      pOVar14 = IR::Instr::GetSrc2(_src1Forms);
      IVar7 = IR::Opnd::GetType(pOVar14);
      if (TySize[IVar7] == 8) {
        pOVar14 = IR::Instr::GetSrc2(_src1Forms);
        value = IR::Opnd::GetImmediateValue(pOVar14,_src1Forms->m_func);
        bVar2 = Math::FitsInDWord(value);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                             ,0x762,
                             "(!instr->GetSrc2() || !instr->GetSrc2()->IsImmediateOpnd() || (TySize[instr->GetSrc2()->GetType()] != 8) || Math::FitsInDWord(instr->GetSrc2()->GetImmediateValue(instr->m_func)))"
                             ,
                             "!instr->GetSrc2() || !instr->GetSrc2()->IsImmediateOpnd() || (TySize[instr->GetSrc2()->GetType()] != 8) || Math::FitsInDWord(instr->GetSrc2()->GetImmediateValue(instr->m_func))"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
      }
    }
  }
  return;
}

Assistant:

void
LowererMD::Legalize(IR::Instr *const instr, bool fPostRegAlloc)
{
    Assert(instr);
    Assert(!instr->isInlineeEntryInstr
        || (instr->m_opcode == Js::OpCode::MOV && instr->GetSrc1()->IsIntConstOpnd()));

    const bool isMDOpCode = instr->m_opcode > Js::OpCode::MDStart;
    Assert(isMDOpCode || Lowerer::ValidOpcodeAfterLower(instr, instr->m_func));

    const LegalInstrForms legalInstrForms = isMDOpCode ? AllLegalInstrForms[instr->m_opcode - (Js::OpCode::MDStart + 1)] : LegalInstrFormsImpl::LEGAL_NONE;
    LegalForms dstForms = legalInstrForms.dst;
    LegalForms src1Forms = legalInstrForms.src[0];
    LegalForms src2Forms = legalInstrForms.src[1];

    bool hasSwitchCase = true;
    bool isCustomForm = (dstForms & LF_Custom) != 0;;
    switch(instr->m_opcode)
    {
        case Js::OpCode::JA:
        case Js::OpCode::JAE:
        case Js::OpCode::JB:
        case Js::OpCode::JBE:
        case Js::OpCode::JEQ:
        case Js::OpCode::JNE:
        case Js::OpCode::JLT:
        case Js::OpCode::JLE:
        case Js::OpCode::JGT:
        case Js::OpCode::JGE:
        case Js::OpCode::JNO:
        case Js::OpCode::JO:
        case Js::OpCode::JP:
        case Js::OpCode::JNP:
        case Js::OpCode::JNSB:
        case Js::OpCode::JSB:
        case Js::OpCode::JMP:
            Assert(instr->IsBranchInstr());
            break;

        case Js::OpCode::MOV:
        {
            Assert(instr->GetSrc2() == nullptr);

            IR::Opnd *const dst = instr->GetDst();
            const IRType dstType = dst->GetType();
            IR::Opnd *const src = instr->GetSrc1();
            const IRType srcType = src->GetType();
            if(TySize[dstType] > TySize[srcType])
            {
                if (verify)
                {
                    return;
                }
            #if DBG
                switch(dstType)
                {
                    case TyInt32:
                    case TyUint32:
            #ifdef _M_X64
                    case TyInt64:
                    case TyUint64:
            #endif
                    case TyVar:
                        break;

                    default:
                        Assert(false);
                }
            #endif

                IR::IntConstOpnd *const intConstantSrc = src->IsIntConstOpnd() ? src->AsIntConstOpnd() : nullptr;
                const auto UpdateIntConstantSrc = [&](const size_t extendedValue)
                {
                    Assert(intConstantSrc);

                #ifdef _M_X64
                    if(TySize[dstType] > sizeof(IntConstType))
                    {
                        instr->ReplaceSrc1(
                            IR::AddrOpnd::New(
                                reinterpret_cast<void *>(extendedValue),
                                IR::AddrOpndKindConstantVar,
                                instr->m_func,
                                intConstantSrc->m_dontEncode));
                    }
                    else
                #endif
                    {
                        intConstantSrc->SetType(dstType);
                        intConstantSrc->SetValue(static_cast<IntConstType>(extendedValue));
                    }
                };

                switch(srcType)
                {
                    case TyInt8:
                        if(intConstantSrc)
                        {
                            UpdateIntConstantSrc(static_cast<int8>(intConstantSrc->GetValue())); // sign-extend
                            break;
                        }
                        instr->m_opcode = Js::OpCode::MOVSX;
                        break;

                    case TyUint8:
                        if(intConstantSrc)
                        {
                            UpdateIntConstantSrc(static_cast<uint8>(intConstantSrc->GetValue())); // zero-extend
                            break;
                        }
                        instr->m_opcode = Js::OpCode::MOVZX;
                        break;

                    case TyInt16:
                        if(intConstantSrc)
                        {
                            UpdateIntConstantSrc(static_cast<int16>(intConstantSrc->GetValue())); // sign-extend
                            break;
                        }
                        instr->m_opcode = Js::OpCode::MOVSXW;
                        break;

                    case TyUint16:
                        if(intConstantSrc)
                        {
                            UpdateIntConstantSrc(static_cast<uint16>(intConstantSrc->GetValue())); // zero-extend
                            break;
                        }
                        instr->m_opcode = Js::OpCode::MOVZXW;
                        break;

                #ifdef _M_X64
                    case TyInt32:
                        if(intConstantSrc)
                        {
                            UpdateIntConstantSrc(static_cast<int32>(intConstantSrc->GetValue())); // sign-extend
                            break;
                        }
                        instr->m_opcode = Js::OpCode::MOVSXD;
                        break;

                    case TyUint32:
                        if(intConstantSrc)
                        {
                            UpdateIntConstantSrc(static_cast<uint32>(intConstantSrc->GetValue())); // zero-extend
                            break;
                        }
                        switch(dst->GetKind())
                        {
                            case IR::OpndKindReg:
                                // (mov r0.u32, r1.u32) clears the upper 32 bits of r0
                                dst->SetType(TyUint32);
                                instr->m_opcode = Js::OpCode::MOV_TRUNC;
                                break;

                            case IR::OpndKindSym:
                            case IR::OpndKindIndir:
                            case IR::OpndKindMemRef:
                                // Even if the src is a reg, we don't know if the upper 32 bits are zero. Copy the value to a
                                // reg first to zero-extend it to 64 bits, and then copy the 64-bit value to the original dst.
                                instr->HoistSrc1(Js::OpCode::MOV_TRUNC);
                                instr->GetSrc1()->SetType(dstType);
                                break;

                            default:
                                Assert(false);
                                __assume(false);
                        }
                        break;
                #endif

                    default:
                        Assert(false);
                        __assume(false);
                }
            }
            else if (TySize[dstType] < TySize[srcType])
            {
                instr->GetSrc1()->SetType(dst->GetType());
            }

            if(instr->m_opcode == Js::OpCode::MOV)
            {
                // Allow 64 bit values in x64 as well
                src1Forms = L_Reg | L_Mem | L_Ptr;
#if _M_X64
                if (dst->IsMemoryOpnd())
                {
                    // Only allow <= 32 bit values
                    src1Forms = L_Reg | L_Imm32;
                }
#endif
                LegalizeOpnds<verify>(
                    instr,
                    L_Reg | L_Mem,
                    src1Forms,
                    L_None);
            }
            else
            {
                LegalizeOpnds<verify>(
                    instr,
                    L_Reg,
                    L_Reg | L_Mem,
                    L_None);
            }
            break;
        }

        case Js::OpCode::CMOVA:
        case Js::OpCode::CMOVAE:
        case Js::OpCode::CMOVB:
        case Js::OpCode::CMOVBE:
        case Js::OpCode::CMOVE:
        case Js::OpCode::CMOVG:
        case Js::OpCode::CMOVGE:
        case Js::OpCode::CMOVL:
        case Js::OpCode::CMOVLE:
        case Js::OpCode::CMOVNE:
        case Js::OpCode::CMOVNO:
        case Js::OpCode::CMOVNP:
        case Js::OpCode::CMOVNS:
        case Js::OpCode::CMOVO:
        case Js::OpCode::CMOVP:
        case Js::OpCode::CMOVS:
            if (instr->GetSrc2())
            {
                Assert(instr->GetDst()->GetSize() == instr->GetSrc2()->GetSize());
                Assert(instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize());

                // 0 shouldn't be the src2 of a CMOVcc.
                // CMOVcc doesn't support moving a constant and the legalizer will hoist the load of the constant
                // to a register. If the constant was 0, Peeps will turn it into a XOR which, in turn, may change
                // the zero flags and hence the result of CMOVcc. If you do want to CMOVcc 0, you should load 0
                // into a register before the instruction whose result the CMOVcc depends on.
                Assert(!instr->GetSrc2()->IsIntConstOpnd() || instr->GetSrc2()->AsIntConstOpnd()->GetValue() != 0);
                // sometimes we have fake src1 to help reg alloc
                LegalizeOpnds<verify>(
                    instr,
                    L_Reg,
                    L_Reg,
                    L_Reg | L_Mem);
            }
            else
            {
                Assert(instr->GetDst()->GetSize() == instr->GetSrc1()->GetSize());
                LegalizeOpnds<verify>(
                    instr,
                    L_Reg,
                    L_Reg | L_Mem,
                    L_None);
            }
            break;

        case Js::OpCode::MOVSD:
        case Js::OpCode::MOVSS:
            Assert(instr->GetDst()->GetType() == (instr->m_opcode == Js::OpCode::MOVSD? TyFloat64 : TyFloat32) || instr->GetDst()->IsSimd128());
            Assert(instr->GetSrc1()->GetType() == (instr->m_opcode == Js::OpCode::MOVSD ? TyFloat64 : TyFloat32) || instr->GetSrc1()->IsSimd128());
            goto LegalizeDefault;

        case Js::OpCode::NOP:
        {
            Assert(!instr->GetSrc2());
#if _M_IX86
            RegNum edx = RegEDX;
#else
            RegNum edx = RegRDX;
#endif
            // Special case handled by peeps
            Assert(!instr->GetDst() || (instr->GetDst()->IsRegOpnd() && instr->GetDst()->AsRegOpnd()->GetReg() == edx));
            break;
        }
        case Js::OpCode::MOVSX:
        case Js::OpCode::MOVSXW:
            Assert(instr->GetDst()->GetSize() == 4 || instr->GetDst()->GetSize() == 8);
            Assert(instr->m_opcode != Js::OpCode::MOVSX || instr->GetSrc1()->GetSize() == 1);
            Assert(instr->m_opcode != Js::OpCode::MOVSXW || instr->GetSrc1()->GetSize() == 2);
            goto LegalizeDefault;

        case Js::OpCode::LOCKCMPXCHG8B:
        case Js::OpCode::CMPXCHG8B:
        {
            const auto getRegMask = [](IR::Opnd* opnd)
            {
                Assert(opnd->IsListOpnd());
                return opnd->AsListOpnd()->Reduce(
                [](int i, IR::Opnd* opnd) {
                    Assert(opnd->IsRegOpnd());
                    return 1 << opnd->AsRegOpnd()->GetReg();
                },
                [](int i, uint32 regmask, uint32 allReg)
                {
                    AssertMsg((allReg & regmask) == 0, "Should not have the same register twice");
                    return allReg | regmask;
                }, 0);
            };
#if _M_IX86
            const uint32 dstMask = (1 << RegEAX | 1 << RegEDX);
            const uint32 srcMask = (1 << RegEAX | 1 << RegEBX | 1 << RegECX | 1 << RegEDX);
#else
            const uint32 dstMask = (1 << RegRAX | 1 << RegRDX);
            const uint32 srcMask = (1 << RegRAX | 1 << RegRBX | 1 << RegRCX | 1 << RegRDX);
#endif

            AssertMsg(!instr->m_func->isPostFinalLower || !instr->GetDst(), "After FinalLower, there should not be a dst");
            AssertMsg(instr->m_func->isPostFinalLower || getRegMask(instr->GetDst()) == dstMask,
                "Before FinalLower, instr should have eax,edx as dst");
            AssertMsg(!instr->m_func->isPostFinalLower || !instr->GetSrc2(), "After FinalLower, there should not be a src2");
            AssertMsg(instr->m_func->isPostFinalLower || getRegMask(instr->GetSrc2()) == srcMask,
                "Before FinalLower, instr should have eax,edx,ecx,ebx as src2");
            LegalizeSrc<verify>(
                instr,
                instr->GetSrc1(),
                L_Mem);
            break;
        }
        case Js::OpCode::TEST:
            if((instr->GetSrc1()->IsImmediateOpnd() && !instr->GetSrc2()->IsImmediateOpnd()) ||
                (instr->GetSrc2()->IsMemoryOpnd() && !instr->GetSrc1()->IsMemoryOpnd()))
            {
                if (verify)
                {
                    AssertMsg(false, "Invalid Js::OpCode::TEST opnd order. Missing legalization");
                    return;
                }
                instr->SwapOpnds();
            }
            goto LegalizeDefault;

        case Js::OpCode::SHL:
        case Js::OpCode::SHR:
        case Js::OpCode::SAR:
        case Js::OpCode::ROL:
        case Js::OpCode::ROR:
            if (verify)
            {
                Assert(instr->GetSrc2()->IsIntConstOpnd()
                    || instr->GetSrc2()->AsRegOpnd()->GetReg() == LowererMDArch::GetRegShiftCount());
            }
            else
            {
                if(!instr->GetSrc2()->IsIntConstOpnd())
                {
                    IR::Instr *const newInstr = instr->HoistSrc2(Js::OpCode::MOV);
                    newInstr->GetDst()->AsRegOpnd()->SetReg(LowererMDArch::GetRegShiftCount());
                    instr->GetSrc2()->AsRegOpnd()->SetReg(LowererMDArch::GetRegShiftCount());
                }
                instr->GetSrc2()->SetType(TyUint8);
            }
            goto LegalizeDefault;

        case Js::OpCode::TZCNT:
            Assert(AutoSystemInfo::Data.TZCntAvailable());
            goto LegalizeDefault;
        case Js::OpCode::LZCNT:
            Assert(AutoSystemInfo::Data.LZCntAvailable());
            goto LegalizeDefault;

        case Js::OpCode::ROUNDSD:
        case Js::OpCode::ROUNDSS:
            Assert(AutoSystemInfo::Data.SSE4_1Available());
            goto LegalizeDefault;

        default:
LegalizeDefault:
            if (isMDOpCode)
            {
                AssertMsg(!isCustomForm, "Custom legal forms should have a case in the switch statement");
                hasSwitchCase = false;

                if (EncoderMD::IsOPEQ(instr))
                {
                    MakeDstEquSrc1<verify>(instr);
                    Assert((dstForms & L_FormMask) == (src1Forms & L_FormMask));
                }

                LegalizeOpnds<verify>(
                    instr,
                    dstForms,
                    src1Forms,
                    src2Forms);
            }
            break;
    }

#if DBG
    // Asserting general rules
    // There should be at most 1 memory opnd in an instruction
    if (instr->GetDst() && instr->GetDst()->IsMemoryOpnd())
    {
        // All memref address need to fit in a dword
        Assert(!instr->GetDst()->IsMemRefOpnd() || Math::FitsInDWord((size_t)instr->GetDst()->AsMemRefOpnd()->GetMemLoc()));
        if (instr->GetSrc1())
        {
            Assert(instr->GetSrc1()->IsEqual(instr->GetDst()) || !instr->GetSrc1()->IsMemoryOpnd());
            if (instr->GetSrc2())
            {
                Assert(!instr->GetSrc2()->IsMemoryOpnd());
            }
        }
    }
    else if (instr->GetSrc1() && instr->GetSrc1()->IsMemoryOpnd())
    {
        // All memref address need to fit in a dword
        Assert(!instr->GetSrc1()->IsMemRefOpnd() || Math::FitsInDWord((size_t)instr->GetSrc1()->AsMemRefOpnd()->GetMemLoc()));
        Assert(!instr->GetSrc2() || !instr->GetSrc2()->IsMemoryOpnd());
    }
    else if (instr->GetSrc2() && instr->GetSrc2()->IsMemRefOpnd())
    {
        // All memref address need to fit in a dword
        Assert(Math::FitsInDWord((size_t)instr->GetSrc2()->AsMemRefOpnd()->GetMemLoc()));
    }

    // Non-MOV (second operand) immediate need to fit in DWORD for AMD64
    Assert(!instr->GetSrc2() || !instr->GetSrc2()->IsImmediateOpnd()
        || (TySize[instr->GetSrc2()->GetType()] != 8) || Math::FitsInDWord(instr->GetSrc2()->GetImmediateValue(instr->m_func)));
#endif
}